

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O3

char __thiscall
ModbusSimulationDataGenerator::BinToLATIN1(ModbusSimulationDataGenerator *this,U8 value)

{
  char cVar1;
  
  cVar1 = '0';
  if ((byte)(value - 1) < 0xf) {
    cVar1 = (&DAT_0011eb14)[(byte)(value - 1)];
  }
  return cVar1;
}

Assistant:

char ModbusSimulationDataGenerator::BinToLATIN1( U8 value )
{
    switch( value )
    {
    case 0:
        return '0';
    case 1:
        return '1';
    case 2:
        return '2';
    case 3:
        return '3';
    case 4:
        return '4';
    case 5:
        return '5';
    case 6:
        return '6';
    case 7:
        return '7';
    case 8:
        return '8';
    case 9:
        return '9';
    case 0xA:
        return 'A';
    case 0xB:
        return 'B';
    case 0xC:
        return 'C';
    case 0xD:
        return 'D';
    case 0xE:
        return 'E';
    case 0xF:
        return 'F';
    default:
        return '0';
    }
}